

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O1

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::Reset
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,IPipelineState *pPSO)

{
  ushort uVar1;
  pointer pHVar2;
  pointer pHVar3;
  pointer puVar4;
  PipelineStateVkImpl *pObj;
  RenderDeviceVkImpl *pRVar5;
  RayTracingPipelineDesc *pRVar6;
  pointer this_00;
  
  pHVar2 = (this->m_DbgHitGroupBindings).
           super__Vector_base<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding,_std::allocator<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar3 = (this->m_DbgHitGroupBindings).
           super__Vector_base<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding,_std::allocator<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pHVar2;
  if (pHVar3 != pHVar2) {
    do {
      RefCntWeakPtr<Diligent::TopLevelASVkImpl>::Release(&this_00->pTLAS);
      this_00 = this_00 + 1;
    } while (this_00 != pHVar3);
    (this->m_DbgHitGroupBindings).
    super__Vector_base<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding,_std::allocator<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding>_>
    ._M_impl.super__Vector_impl_data._M_finish = pHVar2;
  }
  puVar4 = (this->m_RayGenShaderRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_RayGenShaderRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar4) {
    (this->m_RayGenShaderRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar4;
  }
  puVar4 = (this->m_MissShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_MissShadersRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar4) {
    (this->m_MissShadersRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar4;
  }
  puVar4 = (this->m_CallableShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_CallableShadersRecord).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (this->m_CallableShadersRecord).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  puVar4 = (this->m_HitGroupsRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_HitGroupsRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar4) {
    (this->m_HitGroupsRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar4;
  }
  this->m_Changed = true;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator=(&this->m_pPSO,(PipelineStateVkImpl *)0x0);
  (this->
  super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
  ).m_Desc.pPSO = pPSO;
  pRVar5 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      );
  ValidateShaderBindingTableDesc
            (&(this->
              super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
              ).m_Desc,
             (pRVar5->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
             ShaderGroupHandleSize,
             (pRVar5->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
             MaxShaderRecordStride);
  pObj = (PipelineStateVkImpl *)
         (this->
         super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
         ).m_Desc.pPSO;
  if (pObj != (PipelineStateVkImpl *)0x0) {
    CheckDynamicType<Diligent::PipelineStateVkImpl,Diligent::IPipelineState>((IPipelineState *)pObj)
    ;
  }
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator=(&this->m_pPSO,pObj);
  pRVar6 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetRayTracingPipelineDesc
                     (&((this->m_pPSO).m_pObject)->
                       super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  uVar1 = pRVar6->ShaderRecordSize;
  this->m_ShaderRecordSize = (uint)uVar1;
  this->m_ShaderRecordStride =
       (uint)uVar1 +
       (pRVar5->
       super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
       ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
       ShaderGroupHandleSize;
  return;
}

Assistant:

Reset(IPipelineState* pPSO) override final
    {
#ifdef DILIGENT_DEVELOPMENT
        this->m_DbgHitGroupBindings.clear();
#endif
        this->m_RayGenShaderRecord.clear();
        this->m_MissShadersRecord.clear();
        this->m_CallableShadersRecord.clear();
        this->m_HitGroupsRecord.clear();
        this->m_Changed = true;
        this->m_pPSO    = nullptr;

        this->m_Desc.pPSO = pPSO;

        const RayTracingProperties& RayTracingProps = this->GetDevice()->GetAdapterInfo().RayTracing;
        try
        {
            ValidateShaderBindingTableDesc(this->m_Desc, RayTracingProps.ShaderGroupHandleSize, RayTracingProps.MaxShaderRecordStride);
        }
        catch (const std::runtime_error&)
        {
            return;
        }

        this->m_pPSO               = ClassPtrCast<PipelineStateImplType>(this->m_Desc.pPSO);
        this->m_ShaderRecordSize   = this->m_pPSO->GetRayTracingPipelineDesc().ShaderRecordSize;
        this->m_ShaderRecordStride = this->m_ShaderRecordSize + RayTracingProps.ShaderGroupHandleSize;
    }